

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

void Wlc_NtkShortNames(Wlc_Ntk_t *p)

{
  ushort uVar1;
  Wlc_Obj_t *pWVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int fFound;
  char pBuffer [100];
  int local_9c;
  char local_98 [104];
  
  iVar4 = (p->vCos).nSize;
  uVar9 = iVar4 - (p->vPos).nSize;
  if (1 < uVar9) {
    uVar6 = uVar9 - 1;
    uVar9 = 0;
    do {
      uVar9 = uVar9 + 1;
      bVar3 = 9 < uVar6;
      uVar6 = uVar6 / 10;
    } while (bVar3);
  }
  if (0 < iVar4) {
    lVar12 = 0;
    do {
      iVar5 = (p->vCos).pArray[lVar12];
      lVar7 = (long)iVar5;
      if ((lVar7 < 1) || (p->nObjsAlloc <= iVar5)) goto LAB_0036e98a;
      pWVar2 = p->pObjs;
      if ((pWVar2[lVar7].field_0x1 & 2) == 0) {
        sprintf(local_98,"%s%0*d","fi",(ulong)uVar9,(ulong)(uint)((int)lVar12 - (p->vPos).nSize));
        iVar4 = Abc_NamStrFindOrAdd(p->pManName,local_98,&local_9c);
        uVar6 = (int)((long)pWVar2 + (lVar7 * 0x18 - (long)p->pObjs) >> 3) * -0x55555555;
        if (((int)uVar6 < 0) || ((p->vNameIds).nSize <= (int)uVar6)) goto LAB_0036e9a9;
        (p->vNameIds).pArray[uVar6 & 0x7fffffff] = iVar4;
        iVar4 = (p->vCos).nSize;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar4);
  }
  iVar4 = (p->vCis).nSize;
  if (0 < iVar4) {
    lVar12 = 0;
    do {
      iVar5 = (p->vCis).pArray[lVar12];
      lVar7 = (long)iVar5;
      if ((lVar7 < 1) || (p->nObjsAlloc <= iVar5)) goto LAB_0036e98a;
      pWVar2 = p->pObjs;
      if ((undefined1  [24])((undefined1  [24])pWVar2[lVar7] & (undefined1  [24])0x3f) !=
          (undefined1  [24])0x1) {
        sprintf(local_98,"%s%0*d","fo",(ulong)uVar9,(ulong)(uint)((int)lVar12 - (p->vPis).nSize));
        iVar4 = Abc_NamStrFindOrAdd(p->pManName,local_98,&local_9c);
        uVar6 = (int)((long)pWVar2 + (lVar7 * 0x18 - (long)p->pObjs) >> 3) * -0x55555555;
        if (((int)uVar6 < 0) || ((p->vNameIds).nSize <= (int)uVar6)) goto LAB_0036e9a9;
        (p->vNameIds).pArray[uVar6 & 0x7fffffff] = iVar4;
        iVar4 = (p->vCis).nSize;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar4);
  }
  uVar9 = (p->vPos).nSize;
  uVar6 = uVar9;
  if (1 < uVar9) {
    uVar10 = (ulong)(uVar9 - 1);
    uVar6 = 0;
    do {
      uVar8 = (uint)uVar10;
      uVar10 = uVar10 / 10;
      uVar6 = uVar6 + 1;
    } while (9 < uVar8);
  }
  if (0 < (int)uVar9) {
    uVar10 = 0;
    do {
      iVar4 = (p->vPos).pArray[uVar10];
      if (((long)iVar4 < 1) || (p->nObjsAlloc <= iVar4)) goto LAB_0036e98a;
      pWVar2 = p->pObjs;
      sprintf(local_98,"%s%0*d","po",(ulong)uVar6,uVar10 & 0xffffffff);
      iVar5 = Abc_NamStrFindOrAdd(p->pManName,local_98,&local_9c);
      uVar9 = (int)((long)pWVar2 + ((long)iVar4 * 0x18 - (long)p->pObjs) >> 3) * -0x55555555;
      if (((int)uVar9 < 0) || ((p->vNameIds).nSize <= (int)uVar9)) goto LAB_0036e9a9;
      (p->vNameIds).pArray[uVar9 & 0x7fffffff] = iVar5;
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)(p->vPos).nSize);
  }
  uVar9 = (p->vPis).nSize;
  uVar6 = uVar9;
  if (1 < uVar9) {
    uVar10 = (ulong)(uVar9 - 1);
    uVar6 = 0;
    do {
      uVar8 = (uint)uVar10;
      uVar10 = uVar10 / 10;
      uVar6 = uVar6 + 1;
    } while (9 < uVar8);
  }
  if (0 < (int)uVar9) {
    uVar10 = 0;
    do {
      iVar4 = (p->vPis).pArray[uVar10];
      if (((long)iVar4 < 1) || (p->nObjsAlloc <= iVar4)) goto LAB_0036e98a;
      pWVar2 = p->pObjs;
      sprintf(local_98,"%s%0*d","pi",(ulong)uVar6,uVar10 & 0xffffffff);
      iVar5 = Abc_NamStrFindOrAdd(p->pManName,local_98,&local_9c);
      uVar9 = (int)((long)pWVar2 + ((long)iVar4 * 0x18 - (long)p->pObjs) >> 3) * -0x55555555;
      if (((int)uVar9 < 0) || ((p->vNameIds).nSize <= (int)uVar9)) goto LAB_0036e9a9;
      (p->vNameIds).pArray[uVar9 & 0x7fffffff] = iVar5;
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)(p->vPis).nSize);
  }
  iVar4 = p->iObj;
  uVar10 = (ulong)(iVar4 - 1U);
  if (1 < iVar4 - 1U) {
    uVar11 = (ulong)(iVar4 - 2);
    uVar10 = 0;
    do {
      uVar9 = (uint)uVar11;
      uVar11 = uVar11 / 10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (9 < uVar9);
  }
  if (1 < iVar4) {
    uVar11 = 1;
    lVar12 = 0x18;
    do {
      if ((long)p->nObjsAlloc <= (long)uVar11) {
LAB_0036e98a:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar2 = p->pObjs;
      uVar1 = *(ushort *)(&pWVar2->field_0x0 + lVar12);
      if ((uVar1 & 0x600) == 0 && (uVar1 & 0x3d) != 1) {
        sprintf(local_98,"%s%0*d","n",uVar10,uVar11 & 0xffffffff);
        iVar4 = Abc_NamStrFindOrAdd(p->pManName,local_98,&local_9c);
        uVar9 = (int)((long)pWVar2 + (lVar12 - (long)p->pObjs) >> 3) * -0x55555555;
        if (((int)uVar9 < 0) || ((p->vNameIds).nSize <= (int)uVar9)) {
LAB_0036e9a9:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (p->vNameIds).pArray[uVar9 & 0x7fffffff] = iVar4;
        iVar4 = p->iObj;
      }
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 0x18;
    } while ((long)uVar11 < (long)iVar4);
  }
  return;
}

Assistant:

void Wlc_NtkShortNames( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj;
    char pBuffer[100];
    int nDigits, NameId, fFound, i;
    int nFlops = Wlc_NtkCoNum(p) - Wlc_NtkPoNum(p);
    nDigits = Abc_Base10Log( nFlops );
    Wlc_NtkForEachCo( p, pObj, i )
    {
        if ( Wlc_ObjIsPo(pObj) )
            continue;
        sprintf( pBuffer, "%s%0*d", "fi", nDigits, i - Wlc_NtkPoNum(p) );
        NameId = Abc_NamStrFindOrAdd( p->pManName, pBuffer, &fFound );
        Wlc_ObjSetNameId( p, Wlc_ObjId(p, pObj), NameId );
    }
    Wlc_NtkForEachCi( p, pObj, i )
    {
        if ( Wlc_ObjIsPi(pObj) )
            continue;
        sprintf( pBuffer, "%s%0*d", "fo", nDigits, i - Wlc_NtkPiNum(p) );
        NameId = Abc_NamStrFindOrAdd( p->pManName, pBuffer, &fFound );
        Wlc_ObjSetNameId( p, Wlc_ObjId(p, pObj), NameId );
    }
    nDigits = Abc_Base10Log( Wlc_NtkPoNum(p) );
    Wlc_NtkForEachPo( p, pObj, i )
    {
        sprintf( pBuffer, "%s%0*d", "po", nDigits, i );
        NameId = Abc_NamStrFindOrAdd( p->pManName, pBuffer, &fFound );
        Wlc_ObjSetNameId( p, Wlc_ObjId(p, pObj), NameId );
    }
    nDigits = Abc_Base10Log( Wlc_NtkPiNum(p) );
    Wlc_NtkForEachPi( p, pObj, i )
    {
        sprintf( pBuffer, "%s%0*d", "pi", nDigits, i );
        NameId = Abc_NamStrFindOrAdd( p->pManName, pBuffer, &fFound );
        Wlc_ObjSetNameId( p, Wlc_ObjId(p, pObj), NameId );
    }
    nDigits = Abc_Base10Log( Wlc_NtkObjNum(p) );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( Wlc_ObjIsCi(pObj) || Wlc_ObjIsCo(pObj) )
            continue;
        sprintf( pBuffer, "%s%0*d", "n", nDigits, i );
        NameId = Abc_NamStrFindOrAdd( p->pManName, pBuffer, &fFound );
        Wlc_ObjSetNameId( p, Wlc_ObjId(p, pObj), NameId );
    }
}